

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O0

int Cudd_addLeq(DdManager *dd,DdNode *f,DdNode *g)

{
  int iVar1;
  DdNode *pDVar2;
  bool local_65;
  uint local_64;
  uint local_60;
  uint res;
  uint topg;
  uint topf;
  DdNode *gvn;
  DdNode *gv;
  DdNode *fvn;
  DdNode *fv;
  DdNode *tmp;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f == g) {
    return 1;
  }
  if (f->index == 0x7fffffff) {
    if (g->index == 0x7fffffff) {
      return (uint)((f->type).value <= (g->type).value);
    }
    if (f == dd->minusinfinity) {
      return 1;
    }
    if (f == dd->plusinfinity) {
      return 0;
    }
  }
  if (g == dd->plusinfinity) {
    dd_local._4_4_ = 1;
  }
  else if (g == dd->minusinfinity) {
    dd_local._4_4_ = 0;
  }
  else {
    pDVar2 = cuddCacheLookup2(dd,Cudd_addLeq,f,g);
    if (pDVar2 == (DdNode *)0x0) {
      if (f->index == 0x7fffffff) {
        local_60 = f->index;
      }
      else {
        local_60 = dd->perm[f->index];
      }
      if (g->index == 0x7fffffff) {
        local_64 = g->index;
      }
      else {
        local_64 = dd->perm[g->index];
      }
      gv = f;
      fvn = f;
      if (local_60 <= local_64) {
        fvn = (f->type).kids.T;
        gv = (f->type).kids.E;
      }
      _topg = g;
      gvn = g;
      if (local_64 <= local_60) {
        gvn = (g->type).kids.T;
        _topg = (g->type).kids.E;
      }
      iVar1 = Cudd_addLeq(dd,gv,_topg);
      local_65 = false;
      if (iVar1 != 0) {
        iVar1 = Cudd_addLeq(dd,fvn,gvn);
        local_65 = iVar1 != 0;
      }
      dd_local._4_4_ = (uint)local_65;
      cuddCacheInsert2(dd,Cudd_addLeq,f,g,
                       (DdNode *)((ulong)dd->one ^ (long)(int)(uint)(dd_local._4_4_ == 0)));
    }
    else {
      dd_local._4_4_ = (uint)(pDVar2 == dd->one);
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_addLeq(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *tmp, *fv, *fvn, *gv, *gvn;
    unsigned int topf, topg, res;

    /* Terminal cases. */
    if (f == g) return(1);

    statLine(dd);
    if (cuddIsConstant(f)) {
        if (cuddIsConstant(g)) return(cuddV(f) <= cuddV(g));
        if (f == DD_MINUS_INFINITY(dd)) return(1);
        if (f == DD_PLUS_INFINITY(dd)) return(0); /* since f != g */
    }
    if (g == DD_PLUS_INFINITY(dd)) return(1);
    if (g == DD_MINUS_INFINITY(dd)) return(0); /* since f != g */

    /* Check cache. */
    tmp = cuddCacheLookup2(dd,(DD_CTFP)Cudd_addLeq,f,g);
    if (tmp != NULL) {
        return(tmp == DD_ONE(dd));
    }

    /* Compute cofactors. One of f and g is not constant. */
    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    if (topf <= topg) {
        fv = cuddT(f); fvn = cuddE(f);
    } else {
        fv = fvn = f;
    }
    if (topg <= topf) {
        gv = cuddT(g); gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    res = Cudd_addLeq(dd,fvn,gvn) && Cudd_addLeq(dd,fv,gv);

    /* Store result in cache and return. */
    cuddCacheInsert2(dd,(DD_CTFP) Cudd_addLeq,f,g,
                     Cudd_NotCond(DD_ONE(dd),res==0));
    return(res);

}